

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O3

Object<(anonymous_namespace)::RootPresets> * __thiscall
cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>
::BindPrivate(Object<(anonymous_namespace)::RootPresets> *this,string_view *name,
             MemberFunction *func,bool required)

{
  pointer *ppMVar1;
  undefined8 *puVar2;
  pointer pMVar3;
  pointer pMVar4;
  _Manager_type p_Var5;
  size_t sVar6;
  char *pcVar7;
  undefined8 uVar8;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp;
  ulong uVar9;
  pointer pMVar10;
  pointer pMVar11;
  ulong uVar12;
  pointer pMVar13;
  _Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
  *this_00;
  long lVar14;
  _Any_data local_88;
  _Manager_type local_78;
  _Invoker_type p_Stack_70;
  undefined1 local_68;
  void *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  
  sVar6 = name->_M_len;
  pcVar7 = name->_M_str;
  local_58 = (void *)0x0;
  uStack_50 = 0;
  local_48 = 0;
  local_78 = (func->super__Function_base)._M_manager;
  p_Stack_70 = func->_M_invoker;
  if (local_78 != (_Manager_type)0x0) {
    local_58 = *(void **)&(func->super__Function_base)._M_functor;
    uStack_50 = *(undefined8 *)((long)&(func->super__Function_base)._M_functor + 8);
    (func->super__Function_base)._M_manager = (_Manager_type)0x0;
    func->_M_invoker = (_Invoker_type)0x0;
  }
  local_88._M_unused._M_object = local_58;
  local_88._8_8_ = uStack_50;
  pMVar3 = (this->Members).
           super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pMVar4 = (this->Members).
           super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68 = required;
  if (pMVar3 == pMVar4) {
    pMVar3 = (this->Members).
             super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar14 = (long)pMVar4 - (long)pMVar3;
    if (lVar14 == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar12 = (lVar14 >> 3) * 0x6db6db6db6db6db7;
    uVar9 = 1;
    if (pMVar4 != pMVar3) {
      uVar9 = uVar12;
    }
    this_00 = (_Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
               *)(uVar9 + uVar12);
    if ((_Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
         *)0x249249249249248 < this_00) {
      this_00 = (_Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
                 *)0x249249249249249;
    }
    if (CARRY8(uVar9,uVar12)) {
      this_00 = (_Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
                 *)0x249249249249249;
    }
    pMVar10 = std::
              _Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
              ::_M_allocate(this_00,(size_t)p_Stack_70);
    *(size_t *)((long)pMVar10 + lVar14) = sVar6;
    ((size_t *)((long)pMVar10 + lVar14))[1] = (size_t)pcVar7;
    puVar2 = (undefined8 *)((long)pMVar10 + lVar14 + 0x10);
    *puVar2 = 0;
    puVar2[1] = 0;
    *(undefined8 *)((long)pMVar10 + lVar14 + 0x20) = 0;
    *(_Invoker_type *)((long)pMVar10 + lVar14 + 0x28) = p_Stack_70;
    if (local_78 != (_Manager_type)0x0) {
      *(void **)((long)pMVar10 + lVar14 + 0x10) = local_88._M_unused._M_object;
      *(undefined8 *)((long)pMVar10 + lVar14 + 0x18) = local_88._8_8_;
      *(_Manager_type *)((long)pMVar10 + lVar14 + 0x20) = local_78;
      local_78 = (_Manager_type)0x0;
      p_Stack_70 = (_Invoker_type)0x0;
    }
    *(undefined1 *)((long)pMVar10 + lVar14 + 0x30) = local_68;
    pMVar13 = pMVar10;
    for (pMVar11 = pMVar3; pMVar4 != pMVar11; pMVar11 = pMVar11 + 1) {
      pcVar7 = (pMVar11->Name)._M_str;
      (pMVar13->Name)._M_len = (pMVar11->Name)._M_len;
      (pMVar13->Name)._M_str = pcVar7;
      *(undefined8 *)&(pMVar13->Function).super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&(pMVar13->Function).super__Function_base._M_functor + 8) = 0;
      (pMVar13->Function).super__Function_base._M_manager = (_Manager_type)0x0;
      (pMVar13->Function)._M_invoker = (pMVar11->Function)._M_invoker;
      p_Var5 = (pMVar11->Function).super__Function_base._M_manager;
      if (p_Var5 != (_Manager_type)0x0) {
        uVar8 = *(undefined8 *)((long)&(pMVar11->Function).super__Function_base._M_functor + 8);
        *(undefined8 *)&(pMVar13->Function).super__Function_base._M_functor =
             *(undefined8 *)&(pMVar11->Function).super__Function_base._M_functor;
        *(undefined8 *)((long)&(pMVar13->Function).super__Function_base._M_functor + 8) = uVar8;
        (pMVar13->Function).super__Function_base._M_manager = p_Var5;
        (pMVar11->Function).super__Function_base._M_manager = (_Manager_type)0x0;
        (pMVar11->Function)._M_invoker = (_Invoker_type)0x0;
      }
      pMVar13->Required = pMVar11->Required;
      pMVar13 = pMVar13 + 1;
    }
    if (pMVar3 != (pointer)0x0) {
      operator_delete(pMVar3,(long)(this->Members).
                                   super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pMVar3
                     );
    }
    (this->Members).
    super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
    ._M_impl.super__Vector_impl_data._M_start = pMVar10;
    (this->Members).
    super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar13 + 1;
    (this->Members).
    super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pMVar10 + (long)this_00;
  }
  else {
    (pMVar3->Name)._M_len = sVar6;
    (pMVar3->Name)._M_str = pcVar7;
    *(undefined8 *)&(pMVar3->Function).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(pMVar3->Function).super__Function_base._M_functor + 8) = 0;
    (pMVar3->Function).super__Function_base._M_manager = (_Manager_type)0x0;
    (pMVar3->Function)._M_invoker = p_Stack_70;
    if (local_78 != (_Manager_type)0x0) {
      *(void **)&(pMVar3->Function).super__Function_base._M_functor = local_58;
      *(undefined8 *)((long)&(pMVar3->Function).super__Function_base._M_functor + 8) = uStack_50;
      (pMVar3->Function).super__Function_base._M_manager = local_78;
      local_78 = (_Manager_type)0x0;
      p_Stack_70 = (_Invoker_type)0x0;
    }
    pMVar3->Required = required;
    ppMVar1 = &(this->Members).
               super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  if (required) {
    this->AnyRequired = true;
  }
  if (local_78 != (_Manager_type)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  return this;
}

Assistant:

Object& BindPrivate(const cm::string_view& name, MemberFunction&& func,
                        bool required)
    {
      Member m;
      m.Name = name;
      m.Function = std::move(func);
      m.Required = required;
      this->Members.push_back(std::move(m));
      if (required) {
        this->AnyRequired = true;
      }
      return *this;
    }